

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow_conflict *pIVar3;
  char *__s;
  char *__s_00;
  bool bVar4;
  ImGuiContext_conflict *pIVar5;
  size_t sVar6;
  ImGuiContext_conflict *pIVar7;
  uint local_8c;
  int indentation;
  int line_length;
  _Bool is_last_line;
  char *line_end;
  char *line_start;
  char *text_remaining;
  int tree_depth;
  _Bool log_new_line;
  char *suffix;
  char *prefix;
  ImGuiWindow_conflict *window;
  ImGuiContext_conflict *g;
  char *text_end_local;
  char *text_local;
  ImVec2 *ref_pos_local;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  __s = GImGui->LogNextPrefix;
  __s_00 = GImGui->LogNextSuffix;
  GImGui->LogNextSuffix = (char *)0x0;
  pIVar5->LogNextPrefix = (char *)0x0;
  g = (ImGuiContext_conflict *)text_end;
  if (text_end == (char *)0x0) {
    g = (ImGuiContext_conflict *)FindRenderedTextEnd(text,(char *)0x0);
  }
  bVar4 = false;
  if (ref_pos != (ImVec2 *)0x0) {
    bVar4 = pIVar5->LogLinePosY + (pIVar5->Style).FramePadding.y + 1.0 < ref_pos->y;
    pIVar5->LogLinePosY = ref_pos->y;
  }
  if (bVar4) {
    LogText("\n");
    pIVar5->LogLineFirstItem = true;
  }
  if (__s != (char *)0x0) {
    sVar6 = strlen(__s);
    LogRenderedText(ref_pos,__s,__s + sVar6);
  }
  if ((pIVar3->DC).TreeDepth < pIVar5->LogDepthRef) {
    pIVar5->LogDepthRef = (pIVar3->DC).TreeDepth;
  }
  iVar1 = (pIVar3->DC).TreeDepth;
  iVar2 = pIVar5->LogDepthRef;
  line_start = text;
  while( true ) {
    pIVar7 = (ImGuiContext_conflict *)ImStreolRange(line_start,&g->Initialized);
    if (((ImGuiContext_conflict *)line_start != pIVar7) || (pIVar7 != g)) {
      if ((pIVar5->LogLineFirstItem & 1U) == 0) {
        local_8c = 1;
      }
      else {
        local_8c = (iVar1 - iVar2) * 4;
      }
      LogText("%*s%.*s",(ulong)local_8c,"",(ulong)(uint)((int)pIVar7 - (int)line_start),line_start);
      pIVar5->LogLineFirstItem = false;
      if (pIVar7->Initialized == true) {
        LogText("\n");
        pIVar5->LogLineFirstItem = true;
      }
    }
    if (pIVar7 == g) break;
    line_start = &pIVar7->FontAtlasOwnedByContext;
  }
  if (__s_00 != (char *)0x0) {
    sVar6 = strlen(__s_00);
    LogRenderedText(ref_pos,__s_00,__s_00 + sVar6);
  }
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const char* prefix = g.LogNextPrefix;
    const char* suffix = g.LogNextSuffix;
    g.LogNextPrefix = g.LogNextSuffix = NULL;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + g.Style.FramePadding.y + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
    {
        LogText(IM_NEWLINE);
        g.LogLineFirstItem = true;
    }

    if (prefix)
        LogRenderedText(ref_pos, prefix, prefix + strlen(prefix)); // Calculate end ourself to ensure "##" are included here.

    // Re-adjust padding if we have popped out of our starting depth
    if (g.LogDepthRef > window->DC.TreeDepth)
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);

    const char* text_remaining = text;
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by indentation corresponding to the current depth of our log entry.
        // We don't add a trailing \n yet to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_last_line = (line_end == text_end);
        if (line_start != line_end || !is_last_line)
        {
            const int line_length = (int)(line_end - line_start);
            const int indentation = g.LogLineFirstItem ? tree_depth * 4 : 1;
            LogText("%*s%.*s", indentation, "", line_length, line_start);
            g.LogLineFirstItem = false;
            if (*line_end == '\n')
            {
                LogText(IM_NEWLINE);
                g.LogLineFirstItem = true;
            }
        }
        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }

    if (suffix)
        LogRenderedText(ref_pos, suffix, suffix + strlen(suffix));
}